

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

bool __thiscall DReachabilityPropagator::propagate(DReachabilityPropagator *this)

{
  bool bVar1;
  reference piVar2;
  ulong uVar3;
  Tint *in_RDI;
  iterator it;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  DReachabilityPropagator *in_stack_ffffffffffffff80;
  _Rb_tree_const_iterator<int> *this_00;
  long in_stack_ffffffffffffff98;
  _Self local_58;
  _Base_ptr local_50;
  _Self local_48;
  _Base_ptr local_40;
  _Self local_38;
  _Base_ptr local_30;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_const_iterator<int> local_18 [2];
  bool local_1;
  
  update_innodes(in_stack_ffffffffffffff80);
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(local_18);
  local_20 = (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_ffffffffffffff78);
  local_18[0]._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
    bVar1 = std::operator!=(local_18,&local_28);
    if (!bVar1) {
      local_30 = (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                           (in_stack_ffffffffffffff78);
      local_18[0]._M_node = local_30;
      while( true ) {
        local_38._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
        bVar1 = std::operator!=(local_18,&local_38);
        if (!bVar1) {
          local_40 = (_Base_ptr)
                     std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                               (in_stack_ffffffffffffff78);
          local_18[0]._M_node = local_40;
          while( true ) {
            local_48._M_node =
                 (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_ffffffffffffff78)
            ;
            bVar1 = std::operator!=(local_18,&local_48);
            if (!bVar1) {
              local_50 = (_Base_ptr)
                         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                                   (in_stack_ffffffffffffff78);
              local_18[0]._M_node = local_50;
              while( true ) {
                local_58._M_node =
                     (_Base_ptr)
                     std::set<int,_std::less<int>,_std::allocator<int>_>::end
                               (in_stack_ffffffffffffff78);
                bVar1 = std::operator!=(local_18,&local_58);
                if (!bVar1) {
                  bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2af334);
                  if (((bVar1) &&
                      (bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                                         ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2af34b
                                         ), bVar1)) ||
                     (uVar3 = (**(code **)(*(long *)in_RDI + 0x80))(in_RDI,1), (uVar3 & 1) != 0)) {
                    local_1 = true;
                  }
                  else {
                    local_1 = false;
                  }
                  return local_1;
                }
                piVar2 = std::_Rb_tree_const_iterator<int>::operator*
                                   ((_Rb_tree_const_iterator<int> *)0x2af2bf);
                uVar3 = (**(code **)(*(long *)in_RDI + 0x90))(in_RDI,*piVar2);
                if ((uVar3 & 1) == 0) break;
                this_00 = *(_Rb_tree_const_iterator<int> **)(in_RDI + 0x34);
                std::_Rb_tree_const_iterator<int>::operator*
                          ((_Rb_tree_const_iterator<int> *)0x2af2fb);
                Tint::operator=(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
                std::_Rb_tree_const_iterator<int>::operator++(this_00);
              }
              return false;
            }
            piVar2 = std::_Rb_tree_const_iterator<int>::operator*
                               ((_Rb_tree_const_iterator<int> *)0x2af209);
            uVar3 = (**(code **)(*(long *)in_RDI + 0xa0))(in_RDI,*piVar2);
            if ((uVar3 & 1) == 0) break;
            std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x2af245);
            Tint::operator=(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
            std::_Rb_tree_const_iterator<int>::operator++
                      ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff80);
          }
          return false;
        }
        piVar2 = std::_Rb_tree_const_iterator<int>::operator*
                           ((_Rb_tree_const_iterator<int> *)0x2af150);
        uVar3 = (**(code **)(*(long *)in_RDI + 0x98))(in_RDI,*piVar2);
        if ((uVar3 & 1) == 0) break;
        std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x2af18c);
        Tint::operator=(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        std::_Rb_tree_const_iterator<int>::operator++
                  ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff80);
      }
      return false;
    }
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x2af09a);
    uVar3 = (**(code **)(*(long *)in_RDI + 0x88))(in_RDI,*piVar2);
    if ((uVar3 & 1) == 0) break;
    in_stack_ffffffffffffff98 = *(long *)(in_RDI + 0x34);
    std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x2af0d6);
    Tint::operator=(in_RDI,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff80);
  }
  return false;
}

Assistant:

bool DReachabilityPropagator::propagate() {
	update_innodes();  // In case I have not awaken
										 // through DReachabilityPropagator::wakeup method
	if (DEBUG) {
		std::cout << "PROPAGATE" << '\n';
	}

	std::set<int>::iterator it;

	for (it = new_edge.begin(); it != new_edge.end(); ++it) {
		if (!propagateNewEdge(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		last_state_e[*it] = VT_IN;
	}

	for (it = rem_node.begin(); it != rem_node.end(); ++it) {
		if (!propagateRemNode(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		last_state_n[*it] = VT_OUT;
	}

	// In this class, nothing happens here, but this way inheriting classes
	// can be executed here
	for (it = new_node.begin(); it != new_node.end(); ++it) {
		if (!propagateNewNode(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		last_state_n[*it] = VT_IN;
	}

	for (it = rem_edge.begin(); it != rem_edge.end(); ++it) {
		if (!propagateRemEdge(*it)) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
		last_state_e[*it] = VT_OUT;
	}

	if (!new_node.empty() || !rem_edge.empty()) {
		if (DEBUG) {
			std::cout << "Checking new nodes and removed edges" << '\n';
		}
		if (!_propagateReachability()) {
			if (DEBUG) {
				std::cout << "False " << __FILE__ << __LINE__ << '\n';
			}
			return false;
		}
	}

	if (DEBUG) {
		std::cout << "True" << __FILE__ << __LINE__ << '\n';
	}

	return true;
}